

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_x.cxx
# Opt level: O1

void fl_sendClientMessage
               (Window window,Atom message,unsigned_long d0,unsigned_long d1,unsigned_long d2,
               unsigned_long d3,unsigned_long d4)

{
  undefined4 local_c0 [8];
  Window local_a0;
  Atom local_98;
  undefined4 local_90;
  unsigned_long local_88;
  unsigned_long local_80;
  unsigned_long local_78;
  unsigned_long local_70;
  unsigned_long local_68;
  
  local_c0[0] = 0x21;
  local_90 = 0x20;
  local_68 = d4;
  local_a0 = window;
  local_98 = message;
  local_88 = d0;
  local_80 = d1;
  local_78 = d2;
  local_70 = d3;
  XSendEvent(fl_display,window,0,0,local_c0);
  return;
}

Assistant:

void fl_sendClientMessage(Window window, Atom message,
                                 unsigned long d0,
                                 unsigned long d1=0,
                                 unsigned long d2=0,
                                 unsigned long d3=0,
                                 unsigned long d4=0)
{
  XEvent e;
  e.xany.type = ClientMessage;
  e.xany.window = window;
  e.xclient.message_type = message;
  e.xclient.format = 32;
  e.xclient.data.l[0] = (long)d0;
  e.xclient.data.l[1] = (long)d1;
  e.xclient.data.l[2] = (long)d2;
  e.xclient.data.l[3] = (long)d3;
  e.xclient.data.l[4] = (long)d4;
  XSendEvent(fl_display, window, 0, 0, &e);
}